

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool map_loop(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *closure_00;
  gravity_object_t *pgVar1;
  gravity_value_t gVar2;
  gravity_value_t value_00;
  gravity_value_t value_01;
  _Bool _Var3;
  uint32_t n_00;
  gravity_fiber_t *pgVar4;
  gravity_object_t *obj;
  nanotime_t nVar5;
  nanotime_t nVar6;
  nanotime_t t2;
  nanotime_t t1;
  gravity_list_t *list;
  gravity_int_t i;
  gravity_int_t n;
  gravity_map_t *map;
  gravity_value_t value;
  gravity_closure_t *closure;
  char local_2038 [8];
  char _buffer_1 [4096];
  char local_1028 [8];
  char _buffer [4096];
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  _buffer._4088_4_ = rindex;
  _buffer._4094_2_ = nargs;
  if (nargs < 2) {
    snprintf(local_1028,0x1000,"Incorrect number of arguments.");
    pgVar4 = gravity_vm_fiber(vm);
    gravity_fiber_seterror(pgVar4,local_1028);
    _buffer_1._4088_8_ = gravity_class_null;
    value_01.field_1.n = 0;
    value_01.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_01,_buffer._4088_4_);
    vm_local._7_1_ = false;
  }
  else if (args[1].isa == gravity_class_closure) {
    closure_00 = args[1].field_1.p;
    gVar2 = *args;
    pgVar1 = (args->field_1).p;
    n_00 = gravity_hash_count((gravity_hash_t *)pgVar1->objclass);
    list = (gravity_list_t *)0x0;
    obj = (gravity_object_t *)gravity_list_new((gravity_vm *)0x0,n_00);
    gravity_hash_iterate((gravity_hash_t *)pgVar1->objclass,map_keys_array,obj);
    nVar5 = nanotime();
    for (; (long)list < (long)(ulong)n_00; list = (gravity_list_t *)((long)&list->isa + 1)) {
      _Var3 = gravity_vm_runclosure
                        (vm,(gravity_closure_t *)closure_00,gVar2,
                         (gravity_value_t *)(*(long *)&obj->has_outer + (long)list * 0x10),1);
      if (!_Var3) {
        return false;
      }
    }
    nVar6 = nanotime();
    gravity_vm_transfer(vm,obj);
    gVar2.field_1.p = (gravity_object_t *)(nVar6 - nVar5);
    gVar2.isa = gravity_class_int;
    gravity_vm_setslot(vm,gVar2,_buffer._4088_4_);
    vm_local._7_1_ = true;
  }
  else {
    snprintf(local_2038,0x1000,"Argument must be a Closure.");
    pgVar4 = gravity_vm_fiber(vm);
    gravity_fiber_seterror(pgVar4,local_2038);
    value_00.field_1.n = 0;
    value_00.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_00,_buffer._4088_4_);
    vm_local._7_1_ = false;
  }
  return vm_local._7_1_;
}

Assistant:

static bool map_loop (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs < 2) RETURN_ERROR("Incorrect number of arguments.");
    if (!VALUE_ISA_CLOSURE(GET_VALUE(1))) RETURN_ERROR("Argument must be a Closure.");

    gravity_closure_t *closure = VALUE_AS_CLOSURE(GET_VALUE(1));    // closure to execute
    gravity_value_t value = GET_VALUE(0);                            // self parameter
    gravity_map_t *map = VALUE_AS_MAP(GET_VALUE(0));
    register gravity_int_t n = gravity_hash_count(map->hash);        // times to execute the loop
    register gravity_int_t i = 0;

    // build keys array
    // do not transfer newlist to GC because it could be freed during closure execution
    gravity_list_t *list = gravity_list_new(NULL, (uint32_t)n);
    gravity_hash_iterate(map->hash, map_keys_array, (void *)list);

    nanotime_t t1 = nanotime();
    while (i < n) {
        if (!gravity_vm_runclosure(vm, closure, value, &marray_get(list->array, i), 1)) return false;
        ++i;
    }
    nanotime_t t2 = nanotime();
    
    gravity_vm_transfer(vm, (gravity_object_t*) list);
    RETURN_VALUE(VALUE_FROM_INT(t2-t1), rindex);
}